

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O2

ngx_int_t ngx_http_variable_msec(ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  u_char *buf;
  u_char *puVar1;
  ngx_int_t nVar2;
  
  buf = (u_char *)ngx_pnalloc(r->pool,0x18);
  if (buf == (u_char *)0x0) {
    nVar2 = -1;
  }
  else {
    nVar2 = 0;
    puVar1 = ngx_sprintf(buf,"%T.%03M",ngx_cached_time->sec,ngx_cached_time->msec);
    *(uint *)v = ((int)puVar1 - (int)buf & 0xfffffffU) + (*(uint *)v & 0x80000000) + 0x10000000;
    v->data = buf;
  }
  return nVar2;
}

Assistant:

static ngx_int_t
ngx_http_variable_msec(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
    u_char      *p;
    ngx_time_t  *tp;

    p = ngx_pnalloc(r->pool, NGX_TIME_T_LEN + 4);
    if (p == NULL) {
        return NGX_ERROR;
    }

    tp = ngx_timeofday();

    v->len = ngx_sprintf(p, "%T.%03M", tp->sec, tp->msec) - p;
    v->valid = 1;
    v->no_cacheable = 0;
    v->not_found = 0;
    v->data = p;

    return NGX_OK;
}